

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.h
# Opt level: O1

void __thiscall
hwnet::http::HttpRequest::HttpRequest
          (HttpRequest *this,shared_ptr<hwnet::http::HttpSession> *session,
          shared_ptr<hwnet::http::HttpPacket> *packet)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_enable_shared_from_this<hwnet::http::HttpRequest>)._M_weak_this.
  super___weak_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<hwnet::http::HttpRequest>)._M_weak_this.
  super___weak_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->session).super___shared_ptr<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (session->super___shared_ptr<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (session->super___shared_ptr<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->session).super___shared_ptr<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->packet).super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (packet->super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (packet->super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->packet).super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

HttpRequest(const std::shared_ptr<HttpSession> &session,const std::shared_ptr<HttpPacket> &packet):session(session),packet(packet) {

	}